

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool upb_inttable_remove(upb_inttable *t,uintptr_t key,upb_value *val)

{
  byte *pbVar1;
  uint8_t *puVar2;
  upb_value *puVar3;
  byte bVar4;
  _Bool _Var5;
  lookupkey_t key_00;
  
  if (t->array_size <= key) {
    key_00.str.size = (size_t)val;
    key_00.num = key;
    _Var5 = rm(&t->t,key_00,val,(uint)(key >> 0x20) ^ (uint)key,inteql);
    return _Var5;
  }
  puVar2 = t->presence_mask;
  if ((puVar2[key >> 3] >> ((uint)key & 7) & 1) != 0) {
    t->array_count = t->array_count - 1;
    puVar3 = t->array;
    if (val != (upb_value *)0x0) {
      val->val = puVar3[key].val;
    }
    puVar3[key].val = 0xffffffffffffffff;
    bVar4 = (byte)key & 7;
    pbVar1 = puVar2 + (key >> 3);
    *pbVar1 = *pbVar1 & (-2 << bVar4 | 0xfeU >> 8 - bVar4);
    return true;
  }
  return false;
}

Assistant:

bool upb_inttable_remove(upb_inttable* t, uintptr_t key, upb_value* val) {
  bool success;
  if (key < t->array_size) {
    if (upb_inttable_arrhas(t, key)) {
      t->array_count--;
      if (val) {
        *val = t->array[key];
      }
      mutable_array(t)[key] = kInttableSentinel;
      ((uint8_t*)t->presence_mask)[key / 8] &= ~(1 << (key % 8));
      success = true;
    } else {
      success = false;
    }
  } else {
    success = rm(&t->t, intkey(key), val, upb_inthash(key), &inteql);
  }
  check(t);
  return success;
}